

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::staticSolve(btSoftBody *this,int iterations)

{
  psolver_t p_Var1;
  int iseq;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  if (iterations < 1) {
    iterations = iVar3;
  }
  for (; iVar3 != iterations; iVar3 = iVar3 + 1) {
    for (lVar2 = 0; lVar2 < (this->m_cfg).m_psequence.m_size; lVar2 = lVar2 + 1) {
      p_Var1 = getSolver((this->m_cfg).m_psequence.m_data[lVar2]);
      (*p_Var1)(this,1.0,0.0);
    }
  }
  return;
}

Assistant:

void			btSoftBody::staticSolve(int iterations)
{
	for(int isolve=0;isolve<iterations;++isolve)
	{
		for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
		{
			getSolver(m_cfg.m_psequence[iseq])(this,1,0);
		}
	}
}